

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateReplayer::Impl::parse_primitives_generated_query_features
          (Impl *this,Value *state,
          VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **out_features)

{
  VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *pVVar1;
  Type pGVar2;
  
  pVVar1 = (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *)
           ScratchAllocator::allocate_raw(&this->allocator,0x20,0x10);
  if (pVVar1 != (VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT *)0x0) {
    pVVar1->primitivesGeneratedQuery = 0;
    pVVar1->primitivesGeneratedQueryWithRasterizerDiscard = 0;
    *(undefined8 *)&pVVar1->primitivesGeneratedQueryWithNonZeroStreams = 0;
    *(undefined8 *)pVVar1 = 0;
    pVVar1->pNext = (void *)0x0;
  }
  *out_features = pVVar1;
  pGVar2 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"primitivesGeneratedQuery");
  if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    pVVar1->primitivesGeneratedQuery = (pGVar2->data_).s.length;
    pGVar2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)state,"primitivesGeneratedQueryWithNonZeroStreams");
    if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      pVVar1->primitivesGeneratedQueryWithNonZeroStreams = (pGVar2->data_).s.length;
      pGVar2 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)state,"primitivesGeneratedQueryWithRasterizerDiscard");
      if ((undefined1  [16])((undefined1  [16])pGVar2->data_ & (undefined1  [16])0x40000000000000)
          != (undefined1  [16])0x0) {
        pVVar1->primitivesGeneratedQueryWithRasterizerDiscard = (pGVar2->data_).s.length;
        return true;
      }
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/document.h"
                ,0x719,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool StateReplayer::Impl::parse_primitives_generated_query_features(
		const Value &state,
		VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT **out_features)
{
	auto *features = allocator.allocate_cleared<VkPhysicalDevicePrimitivesGeneratedQueryFeaturesEXT>();
	*out_features = features;

	features->primitivesGeneratedQuery = state["primitivesGeneratedQuery"].GetUint();
	features->primitivesGeneratedQueryWithNonZeroStreams = state["primitivesGeneratedQueryWithNonZeroStreams"].GetUint();
	features->primitivesGeneratedQueryWithRasterizerDiscard = state["primitivesGeneratedQueryWithRasterizerDiscard"].GetUint();
	return true;
}